

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLString.hpp
# Opt level: O0

XMLSize_t xercesc_4_0::XMLString::hashN(XMLCh *tohash,XMLSize_t n,XMLSize_t hashModulus)

{
  ulong local_40;
  XMLSize_t i;
  XMLSize_t hashVal;
  XMLCh *curCh;
  XMLSize_t hashModulus_local;
  XMLSize_t n_local;
  XMLCh *tohash_local;
  
  if ((tohash == (XMLCh *)0x0) || (n == 0)) {
    tohash_local = (XMLCh *)0x0;
  }
  else {
    i = (XMLSize_t)(ushort)*tohash;
    hashVal = (XMLSize_t)(tohash + 1);
    for (local_40 = 0; local_40 < n; local_40 = local_40 + 1) {
      i = i * 0x26 + (i >> 0x18) + (ulong)*(ushort *)hashVal;
      hashVal = hashVal + 2;
    }
    tohash_local = (XMLCh *)(i % hashModulus);
  }
  return (XMLSize_t)tohash_local;
}

Assistant:

inline XMLSize_t XMLString::hashN(const   XMLCh* const   tohash
                                  , const XMLSize_t       n
                                  , const XMLSize_t       hashModulus)
{
  if (tohash == 0 || n == 0)
    return 0;

  const XMLCh* curCh = tohash;
  XMLSize_t hashVal = (XMLSize_t)(*curCh++);

  for(XMLSize_t i=0;i<n;i++)
    hashVal = (hashVal * 38) + (hashVal >> 24) + (XMLSize_t)(*curCh++);

  // Divide by modulus
  return hashVal % hashModulus;
}